

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

bool __thiscall booster::locale::date_time::operator!=(date_time *this,date_time *other)

{
  bool bVar1;
  
  bVar1 = operator==(this,other);
  return !bVar1;
}

Assistant:

bool date_time::operator!=(date_time const &other) const
{
    return !(*this==other);
}